

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *matrix)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  complex<double> *pcVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = matrix->size_;
  this->size_ = lVar5;
  if (lVar5 != 0) {
    uVar6 = lVar5 * lVar5 * 0x10;
    pcVar4 = (complex<double> *)
             operator_new__(-(ulong)((ulong)(lVar5 * lVar5) >> 0x3c != 0) | uVar6);
    memset(pcVar4,0,uVar6);
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = pcVar4;
    if (this->size_ != 0) {
      pcVar4 = (matrix->data_)._M_t.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
      lVar5 = 0;
      uVar6 = 0;
      do {
        puVar1 = (undefined8 *)(pcVar4->_M_value + lVar5);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)
                 (((this->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value +
                 lVar5);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < (ulong)(this->size_ * this->size_));
    }
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,
                "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<double>]");
}

Assistant:

inline int64_t size() const { return size_ ; }